

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O0

void * JlRealloc(void *OriginalBuffer,size_t OriginalSize,size_t NewSize)

{
  void *newBuffer;
  void *retPtr;
  size_t NewSize_local;
  size_t OriginalSize_local;
  void *OriginalBuffer_local;
  
  if (((OriginalBuffer == (void *)0x0) || (OriginalSize == 0)) || (NewSize == 0)) {
    newBuffer = (void *)0x0;
  }
  else {
    newBuffer = WjTestLib_Calloc(NewSize,1);
    if (newBuffer == (void *)0x0) {
      newBuffer = (void *)0x0;
    }
    else {
      if (NewSize < OriginalSize) {
        memcpy(newBuffer,OriginalBuffer,NewSize);
      }
      else {
        memcpy(newBuffer,OriginalBuffer,OriginalSize);
      }
      WjTestLib_Free(OriginalBuffer);
    }
  }
  return newBuffer;
}

Assistant:

void*
    JlRealloc
    (
        void*       OriginalBuffer,
        size_t      OriginalSize,
        size_t      NewSize
    )
{
    void* retPtr;

    if(     NULL != OriginalBuffer
        &&  0 != OriginalSize
        &&  0 != NewSize )
    {
        void* newBuffer = JlAlloc( NewSize );
        if( NULL != newBuffer )
        {
            if( NewSize >= OriginalSize )
            {
                memcpy( newBuffer, OriginalBuffer, OriginalSize );
            }
            else
            {
                // Shrunk
                memcpy( newBuffer, OriginalBuffer, NewSize );
            }

            // Deallocate original
            JlFree( OriginalBuffer );
            retPtr = newBuffer;
        }
        else
        {
            // Failed to allocate memory
            retPtr = NULL;
        }
    }
    else
    {
        // Invalid Parameters;
        retPtr = NULL;
    }

    return retPtr;
}